

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20240722::debugging_internal::ParseUnresolvedName(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ParseState copy;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    uVar4 = (state->parse_state).mangled_idx;
    uVar5 = (state->parse_state).out_cur_idx;
    uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    ParseTwoCharToken(state,"gs");
    bVar7 = ParseBaseUnresolvedName(state);
    bVar9 = true;
    if (bVar7) goto LAB_00105479;
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseTwoCharToken(state,"sr");
    if (bVar7) {
      bVar7 = ParseTemplateParam(state);
      if (bVar7) {
        ParseTemplateArgs(state);
      }
      else {
        bVar7 = ParseDecltype(state);
        if (!bVar7) {
          bVar7 = ParseSubstitution(state,false);
          if (!bVar7) goto LAB_00105301;
        }
      }
      bVar7 = ParseBaseUnresolvedName(state);
      if (bVar7) goto LAB_00105479;
    }
LAB_00105301:
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseTwoCharToken(state,"sr");
    if (bVar7) {
      bVar7 = ParseOneCharToken(state,'N');
      if (bVar7) {
        bVar7 = ParseTemplateParam(state);
        if (bVar7) {
          ParseTemplateArgs(state);
        }
        else {
          bVar7 = ParseDecltype(state);
          if (!bVar7) {
            bVar7 = ParseSubstitution(state,false);
            if (!bVar7) goto LAB_001053a2;
          }
        }
        bVar7 = ParseUnresolvedQualifierLevel(state);
        if (bVar7) {
          do {
            bVar8 = ParseUnresolvedQualifierLevel(state);
          } while (bVar8);
          if (bVar7) {
            bVar7 = ParseOneCharToken(state,'E');
            if (bVar7) {
              bVar7 = ParseBaseUnresolvedName(state);
              if (bVar7) goto LAB_00105479;
            }
          }
        }
      }
    }
LAB_001053a2:
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    ParseTwoCharToken(state,"gs");
    bVar7 = ParseTwoCharToken(state,"sr");
    if (bVar7) {
      bVar7 = ParseUnresolvedQualifierLevel(state);
      if (bVar7) {
        do {
          bVar8 = ParseUnresolvedQualifierLevel(state);
        } while (bVar8);
        if (bVar7) {
          bVar7 = ParseOneCharToken(state,'E');
          if (bVar7) {
            bVar7 = ParseBaseUnresolvedName(state);
            if (bVar7) goto LAB_00105479;
          }
        }
      }
    }
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseTwoCharToken(state,"sr");
    if (bVar7) {
      bVar7 = ParseTwoCharToken(state,"St");
      if (bVar7) {
        bVar7 = ParseSourceName(state);
        if (bVar7) {
          ParseTemplateArgs(state);
          if (bVar7) {
            bVar7 = ParseSourceName(state);
            if (bVar7) {
              ParseTemplateArgs(state);
              if (bVar7) goto LAB_00105479;
            }
          }
        }
      }
    }
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  }
  bVar9 = false;
LAB_00105479:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar9;
}

Assistant:

static bool ParseUnresolvedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseUnresolvedType(state) &&
      ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseOneCharToken(state, 'N') &&
      ParseUnresolvedType(state) &&
      OneOrMore(ParseUnresolvedQualifierLevel, state) &&
      ParseOneCharToken(state, 'E') && ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (Optional(ParseTwoCharToken(state, "gs")) &&
      ParseTwoCharToken(state, "sr") &&
      OneOrMore(ParseUnresolvedQualifierLevel, state) &&
      ParseOneCharToken(state, 'E') && ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseTwoCharToken(state, "St") &&
      ParseSimpleId(state) && ParseSimpleId(state)) {
    return true;
  }
  state->parse_state = copy;

  return false;
}